

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_property.c
# Opt level: O2

int mpt_line_set(mpt_line *li,char *name,mpt_convertable *src)

{
  char cVar1;
  int iVar2;
  mpt_lineattr *pmVar3;
  mpt_fpoint *val;
  
  if (name == (char *)0x0) {
    if (src == (mpt_convertable *)0x0) {
      return -4;
    }
    iVar2 = mpt_line_typeid();
    if ((0 < iVar2) && (iVar2 = (*src->_vptr->convert)(src,(mpt_type_t)iVar2,li), -1 < iVar2)) {
      if (iVar2 != 0) {
        return 0;
      }
      (li->color).alpha = 0xff;
      (li->color).red = '\0';
      (li->color).green = '\0';
      (li->color).blue = '\0';
      (li->attr).style = '\x01';
      (li->attr).width = '\x01';
      (li->attr).symbol = '\0';
      (li->attr).size = '\n';
      (li->from).x = 0.0;
      (li->from).y = 0.0;
      (li->to).x = 0.0;
      (li->to).y = 0.0;
      return 0;
    }
    iVar2 = mpt_color_typeid();
    if ((0 < iVar2) && (iVar2 = (*src->_vptr->convert)(src,(mpt_type_t)iVar2,li), -1 < iVar2)) {
      if (iVar2 != 0) {
        return 0;
      }
      (li->color).alpha = 0xff;
      (li->color).red = '\0';
      (li->color).green = '\0';
      (li->color).blue = '\0';
      return 0;
    }
    iVar2 = mpt_lattr_typeid();
    if (iVar2 < 1) {
      return -3;
    }
    pmVar3 = &li->attr;
    iVar2 = (*src->_vptr->convert)(src,(mpt_type_t)iVar2,pmVar3);
    if (iVar2 < 0) {
      return -3;
    }
    if (iVar2 != 0) {
      return 0;
    }
    pmVar3->style = '\x01';
    pmVar3->width = '\x01';
    pmVar3->symbol = '\0';
    pmVar3->size = '\n';
    return 0;
  }
  cVar1 = *name;
  if (cVar1 == 'y') {
    if ((name[1] == '1') && (name[2] == '\0')) {
      val = (mpt_fpoint *)&(li->from).y;
    }
    else {
      if ((name[1] != '2') || (name[2] != '\0')) goto LAB_00106c18;
      val = (mpt_fpoint *)&(li->to).y;
    }
  }
  else {
    if (cVar1 != 'x') {
      if (cVar1 == '\0') {
        if (src == (mpt_convertable *)0x0) {
          (li->color).alpha = 0xff;
          (li->color).red = '\0';
          (li->color).green = '\0';
          (li->color).blue = '\0';
          (li->attr).style = '\x01';
          (li->attr).width = '\x01';
          (li->attr).symbol = '\0';
          (li->attr).size = '\n';
          (li->from).x = 0.0;
          (li->from).y = 0.0;
          (li->to).x = 0.0;
          (li->to).y = 0.0;
          return 0;
        }
        iVar2 = mpt_color_typeid();
        if ((0 < iVar2) && (iVar2 = (*src->_vptr->convert)(src,(mpt_type_t)iVar2,li), 0 < iVar2)) {
          return 0;
        }
        return -3;
      }
LAB_00106c18:
      iVar2 = strcasecmp(name,"color");
      if (iVar2 == 0) {
        iVar2 = mpt_color_pset(&li->color,src);
        return iVar2;
      }
      iVar2 = strcasecmp(name,"width");
      if (iVar2 == 0) {
        iVar2 = mpt_lattr_width(&li->attr,src);
        return iVar2;
      }
      iVar2 = strcasecmp(name,"style");
      if (iVar2 == 0) {
        iVar2 = mpt_lattr_style(&li->attr,src);
        return iVar2;
      }
      iVar2 = strcasecmp(name,"symbol");
      if (iVar2 != 0) {
        iVar2 = strcasecmp(name,"size");
        if (iVar2 != 0) {
          return -1;
        }
        iVar2 = mpt_lattr_size(&li->attr,src);
        return iVar2;
      }
      iVar2 = mpt_lattr_symbol(&li->attr,src);
      return iVar2;
    }
    if ((name[1] == '1') && (name[2] == '\0')) {
      val = &li->from;
    }
    else {
      if ((name[1] != '2') || (name[2] != '\0')) goto LAB_00106c18;
      val = &li->to;
    }
  }
  iVar2 = setPosition(&val->x,src);
  return iVar2;
}

Assistant:

extern int mpt_line_set(MPT_STRUCT(line) *li, const char *name, MPT_INTERFACE(convertable) *src)
{
	int len;
	
	/* auto-select matching property */
	if (!name) {
		int type;
		
		if (!src) {
			return MPT_ERROR(BadOperation);
		}
		if ((type = mpt_line_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, li)) >= 0) {
			if (!len) *li = def_line;
			return 0;
		}
		if ((type = mpt_color_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &li->color)) >= 0) {
			if (!len) li->color = def_line.color;
			return 0;
		}
		if ((type = mpt_lattr_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &li->attr)) >= 0) {
			if (!len) li->attr = def_line.attr;
			return 0;
		}
		return MPT_ERROR(BadType);
	}
	/* copy from sibling */
	if (!*name) {
		int type;
		if (!src) {
			*li = def_line;
			return 0;
		}
		if ((type = mpt_color_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, li)) > 0) {
			return 0;
		}
		return MPT_ERROR(BadType);
	}
	if (!strcmp(name, "x1")) {
		return setPosition(&li->from.x, src);
	}
	if (!strcmp(name, "x2")) {
		return setPosition(&li->to.x, src);
	}
	if (!strcmp(name, "y1")) {
		return setPosition(&li->from.y, src);
	}
	if (!strcmp(name, "y2")) {
		return setPosition(&li->to.y, src);
	}
	if (!strcasecmp(name, "color")) {
		return mpt_color_pset(&li->color, src);
	}
	if (!strcasecmp(name, "width")) {
		return mpt_lattr_width(&li->attr, src);
	}
	if (!strcasecmp(name, "style")) {
		return mpt_lattr_style(&li->attr, src);
	}
	if (!strcasecmp(name, "symbol")) {
		return mpt_lattr_symbol(&li->attr, src);
	}
	if (!strcasecmp(name, "size")) {
		return mpt_lattr_size(&li->attr, src);
	}
	return MPT_ERROR(BadArgument);
}